

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O0

CordRep * absl::lts_20250127::cord_internal::CordRepSubstring::Substring
                    (CordRep *rep,size_t pos,size_t n)

{
  bool bVar1;
  CordRepSubstring *pCVar2;
  CordRep *pCVar3;
  CordRepSubstring *substr;
  size_t n_local;
  size_t pos_local;
  CordRep *rep_local;
  
  if (rep == (CordRep *)0x0) {
    __assert_fail("rep != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0x1a3,
                  "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                 );
  }
  if (n == 0) {
    __assert_fail("n != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0x1a4,
                  "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                 );
  }
  if (rep->length <= pos) {
    __assert_fail("pos < rep->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0x1a5,
                  "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                 );
  }
  if (rep->length - pos < n) {
    __assert_fail("n <= rep->length - pos",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0x1a6,
                  "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                 );
  }
  if (n == rep->length) {
    rep_local = CordRep::Ref(rep);
  }
  else {
    bVar1 = CordRep::IsSubstring(rep);
    n_local = pos;
    pos_local = (size_t)rep;
    if (bVar1) {
      pCVar2 = CordRep::substring(rep);
      n_local = pCVar2->start + pos;
      pCVar2 = CordRep::substring(rep);
      pos_local = (size_t)pCVar2->child;
    }
    rep_local = (CordRep *)operator_new(0x20);
    ((CordRepSubstring *)rep_local)->start = 0;
    ((CordRepSubstring *)rep_local)->child = (CordRep *)0x0;
    (((CordRepSubstring *)rep_local)->super_CordRep).length = 0;
    (((CordRepSubstring *)rep_local)->super_CordRep).refcount = (atomic<int>)0x0;
    (((CordRepSubstring *)rep_local)->super_CordRep).tag = '\0';
    (((CordRepSubstring *)rep_local)->super_CordRep).storage[0] = '\0';
    (((CordRepSubstring *)rep_local)->super_CordRep).storage[1] = '\0';
    (((CordRepSubstring *)rep_local)->super_CordRep).storage[2] = '\0';
    CordRepSubstring((CordRepSubstring *)rep_local);
    (((CordRepSubstring *)rep_local)->super_CordRep).length = n;
    (((CordRepSubstring *)rep_local)->super_CordRep).tag = '\x01';
    ((CordRepSubstring *)rep_local)->start = n_local;
    pCVar3 = CordRep::Ref((CordRep *)pos_local);
    ((CordRepSubstring *)rep_local)->child = pCVar3;
  }
  return rep_local;
}

Assistant:

inline CordRep* CordRepSubstring::Substring(CordRep* rep, size_t pos,
                                            size_t n) {
  assert(rep != nullptr);
  assert(n != 0);
  assert(pos < rep->length);
  assert(n <= rep->length - pos);
  if (n == rep->length) return CordRep::Ref(rep);
  if (rep->IsSubstring()) {
    pos += rep->substring()->start;
    rep = rep->substring()->child;
  }
  CordRepSubstring* substr = new CordRepSubstring();
  substr->length = n;
  substr->tag = SUBSTRING;
  substr->start = pos;
  substr->child = CordRep::Ref(rep);
  return substr;
}